

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

TileArray * __thiscall amrex::FabArrayBase::getTileArray(FabArrayBase *this,IntVect *tilesize)

{
  mapped_type *this_00;
  mapped_type *ta;
  long lVar1;
  IntVect IVar2;
  key_type local_38;
  
  IVar2 = BATransformer::coarsen_ratio(&(this->boxarray).m_bat);
  this_00 = std::
            map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
            ::operator[]((map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
                          *)m_TheTileArrayCache,&this->m_bdkey);
  local_38.first.vect[2] = tilesize->vect[2];
  local_38.first.vect._0_8_ = *(undefined8 *)tilesize->vect;
  local_38.second = IVar2;
  ta = std::
       map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
       ::operator[](this_00,&local_38);
  lVar1 = ta->nuse;
  if (lVar1 == -1) {
    buildTileArray(this,tilesize,ta);
    ta->nuse = 0;
    CacheStats::recordBuild((CacheStats *)m_TAC_stats);
    lVar1 = ta->nuse;
  }
  ta->nuse = lVar1 + 1;
  m_TAC_stats._16_8_ = m_TAC_stats._16_8_ + 1;
  return ta;
}

Assistant:

const FabArrayBase::TileArray*
FabArrayBase::getTileArray (const IntVect& tilesize) const
{
    TileArray* p;

#ifdef AMREX_USE_OMP
#pragma omp critical(gettilearray)
#endif
    {
        BL_ASSERT(getBDKey() == m_bdkey);

        const IntVect& crse_ratio = boxArray().crseRatio();
        p = &FabArrayBase::m_TheTileArrayCache[m_bdkey][std::pair<IntVect,IntVect>(tilesize,crse_ratio)];
        if (p->nuse == -1) {
            buildTileArray(tilesize, *p);
            p->nuse = 0;
            m_TAC_stats.recordBuild();
#ifdef AMREX_MEM_PROFILING
            m_TAC_stats.bytes += p->bytes();
            m_TAC_stats.bytes_hwm = std::max(m_TAC_stats.bytes_hwm,
                                             m_TAC_stats.bytes);
#endif
        }
#ifdef AMREX_USE_OMP
#pragma omp master
#endif
        {
            ++(p->nuse);
            m_TAC_stats.recordUse();
        }
    }

    return p;
}